

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::MembranePipelineHook::getPipelinedCap
          (MembranePipelineHook *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  ClientHook *pCVar1;
  ClientHook *extraout_RDX;
  PipelineOp *pPVar3;
  Own<capnp::ClientHook> OVar4;
  Own<capnp::ClientHook> local_28;
  ClientHook *pCVar2;
  
  pPVar3 = ops.ptr;
  (**(code **)(*(long *)pPVar3[4] + 8))(&local_28,pPVar3[4],ops.size_);
  OVar4 = membrane((anon_unknown_0 *)this,&local_28,(MembranePolicy *)pPVar3[6],
                   SUB41(pPVar3[7].type,0));
  pCVar1 = local_28.ptr;
  pCVar2 = OVar4.ptr;
  if (local_28.ptr != (ClientHook *)0x0) {
    local_28.ptr = (ClientHook *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
    pCVar2 = extraout_RDX;
  }
  OVar4.ptr = pCVar2;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    return membrane(inner->getPipelinedCap(ops), *policy, reverse);
  }